

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O2

void __thiscall
YAJLFrameHeader::YAJLFrameHeader(YAJLFrameHeader *this,u16 marker,bitio_stream *bstream)

{
  ssize_t sVar1;
  ssize_t sVar2;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  uint uVar3;
  YAJLFrameHeaderSpec spec;
  
  (this->specs).super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->specs).super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->specs).super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar1 = bitio::bitio_stream::read(bstream,0x10,bstream,in_RCX);
  this->sof = marker;
  sVar2 = bitio::bitio_stream::read(bstream,8,__buf,in_RCX);
  this->precision = (u8)sVar2;
  sVar2 = bitio::bitio_stream::read(bstream,0x10,__buf_00,in_RCX);
  this->nlines = (u16)sVar2;
  sVar2 = bitio::bitio_stream::read(bstream,0x10,__buf_01,in_RCX);
  this->nsamples_per_line = (u16)sVar2;
  sVar2 = bitio::bitio_stream::read(bstream,8,__buf_02,in_RCX);
  this->ncomponents = (u8)sVar2;
  for (uVar3 = (int)sVar1 + 0xfff8; (uVar3 & 0xffff) != 0; uVar3 = (uVar3 & 0xffff) - 3) {
    YAJLFrameHeaderSpec::YAJLFrameHeaderSpec(&spec,bstream);
    std::vector<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>::push_back
              (&this->specs,&spec);
  }
  return;
}

Assistant:

YAJLFrameHeader::YAJLFrameHeader(u16 marker, bitio::bitio_stream *bstream) {
    u16 length = bstream->read(0x10);
    // remove non-recurring lengths.
    length -= 8;

    sof = marker;
    precision = bstream->read(0x8);
    nlines = bstream->read(0x10);
    nsamples_per_line = bstream->read(0x10);
    ncomponents = bstream->read(0x8);

    while (length > 0) {
        YAJLFrameHeaderSpec spec(bstream);
        specs.push_back(spec);
        length -= 3;
    }
}